

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shannon.c
# Opt level: O1

double inform_shannon_re(inform_dist *p,inform_dist *q,double base)

{
  uint uVar1;
  _Bool _Var2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double local_30;
  
  _Var2 = inform_dist_is_valid(p);
  local_30 = NAN;
  if (((_Var2) && (_Var2 = inform_dist_is_valid(q), _Var2)) && (p->size == q->size)) {
    if (p->size == 0) {
      local_30 = 0.0;
    }
    else {
      local_30 = 0.0;
      uVar3 = 0;
      do {
        uVar1 = p->histogram[uVar3];
        if (uVar1 != 0) {
          if (q->histogram[uVar3] == 0) {
            if ((uVar1 != 0) && (q->histogram[uVar3] == 0)) {
              return NAN;
            }
          }
          else {
            dVar5 = (double)uVar1 /
                    (((double)CONCAT44(0x45300000,(int)(p->counts >> 0x20)) - 1.9342813113834067e+25
                     ) + ((double)CONCAT44(0x43300000,(int)p->counts) - 4503599627370496.0));
            dVar4 = log2(dVar5 / ((double)q->histogram[uVar3] /
                                 (((double)CONCAT44(0x45300000,(int)(q->counts >> 0x20)) -
                                  1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)q->counts) - 4503599627370496.0))
                                 ));
            local_30 = local_30 + dVar4 * dVar5;
          }
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < p->size);
    }
    dVar4 = log2(base);
    local_30 = local_30 / dVar4;
  }
  return local_30;
}

Assistant:

double inform_shannon_re(inform_dist const *p, inform_dist const *q,
    double base)
{
    if (inform_dist_is_valid(p) && inform_dist_is_valid(q) && p->size == q->size)
    {
        double re = 0.;
        for (size_t i = 0; i < p->size; ++i)
        {
            if (p->histogram[i] != 0 && q->histogram[i] != 0)
            {
                double u = (double) p->histogram[i] / p->counts;
                double v = (double) q->histogram[i] / q->counts;
                re += u * log2(u / v);
            }
            else if (p->histogram[i] != 0 && q->histogram[i] == 0)
            {
                return NAN;
            }
        }
        return re / log2(base);
    }
    return NAN;
}